

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::JSONParser::ParseF32Value
          (JSONParser *this,uint32_t *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  if (allow_expected == Yes) {
    *out_value = 0;
    __y._M_str = "nan:canonical";
    __y._M_len = 0xd;
    bVar1 = std::operator==(value_str,__y);
    if (bVar1) {
      *out_nan = Canonical;
    }
    else {
      __y_00._M_str = "nan:arithmetic";
      __y_00._M_len = 0xe;
      bVar1 = std::operator==(value_str,__y_00);
      if (!bVar1) goto LAB_0011946d;
      *out_nan = Arithmetic;
    }
    EVar3 = Ok;
  }
  else {
LAB_0011946d:
    *out_nan = None;
    EVar3 = Ok;
    RVar2 = wabt::ParseInt32(value_str._M_str,value_str._M_str + value_str._M_len,out_value,
                             UnsignedOnly);
    if (RVar2.enum_ == Error) {
      PrintError(this,"invalid f32 literal");
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ParseF32Value(uint32_t* out_value,
                                       ExpectedNan* out_nan,
                                       std::string_view value_str,
                                       AllowExpected allow_expected) {
  if (allow_expected == AllowExpected::Yes) {
    *out_value = 0;
    if (value_str == "nan:canonical") {
      *out_nan = ExpectedNan::Canonical;
      return wabt::Result::Ok;
    } else if (value_str == "nan:arithmetic") {
      *out_nan = ExpectedNan::Arithmetic;
      return wabt::Result::Ok;
    }
  }

  *out_nan = ExpectedNan::None;
  if (Failed(ParseInt32(value_str, out_value, ParseIntType::UnsignedOnly))) {
    PrintError("invalid f32 literal");
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}